

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O1

CAmount wallet::TxGetChange(CWallet *wallet,CTransaction *tx)

{
  CTxOut *pCVar1;
  CAmount CVar2;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ulong uVar5;
  CTxOut *txout;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  unique_lock<std::recursive_mutex> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88._M_device = &(wallet->cs_wallet).super_recursive_mutex;
  local_88._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_88);
  txout = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start;
  pCVar1 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = 0;
  do {
    if (txout == pCVar1) {
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_88);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return uVar5;
      }
LAB_00b881f3:
      __stack_chk_fail();
    }
    CVar2 = OutputGetChange(wallet,txout);
    uVar5 = uVar5 + CVar2;
    if (2100000000000000 < uVar5) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"TxGetChange","");
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_78,": value out of range");
      local_58 = (size_type *)(pbVar3->_M_dataplus)._M_p;
      paVar4 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58 == paVar4) {
        local_48 = paVar4->_M_allocated_capacity;
        uStack_40 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_58 = &local_48;
      }
      else {
        local_48 = paVar4->_M_allocated_capacity;
      }
      local_50 = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      std::runtime_error::runtime_error(this,(string *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00b881f3;
    }
    txout = txout + 1;
  } while( true );
}

Assistant:

CAmount TxGetChange(const CWallet& wallet, const CTransaction& tx)
{
    LOCK(wallet.cs_wallet);
    CAmount nChange = 0;
    for (const CTxOut& txout : tx.vout)
    {
        nChange += OutputGetChange(wallet, txout);
        if (!MoneyRange(nChange))
            throw std::runtime_error(std::string(__func__) + ": value out of range");
    }
    return nChange;
}